

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O3

bool refract(Vec3 *vector,Vec3 *normal,float ni_over_nt,Vec3 *refracted)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar10;
  float fVar11;
  float __x;
  
  fVar1 = vector->e[2];
  uVar3 = *(ulong *)vector->e;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar3;
  fVar9 = (float)(uVar3 >> 0x20);
  fVar4 = SQRT(fVar1 * fVar1 + (float)uVar3 * (float)uVar3 + fVar9 * fVar9);
  auVar8._4_4_ = fVar4;
  auVar8._0_4_ = fVar4;
  auVar8._8_4_ = fVar4;
  auVar8._12_4_ = fVar4;
  auVar8 = divps(auVar7,auVar8);
  fVar10 = (float)*(undefined8 *)normal->e;
  fVar11 = (float)((ulong)*(undefined8 *)normal->e >> 0x20);
  fVar9 = normal->e[2];
  fVar6 = (fVar1 / fVar4) * fVar9 + auVar8._0_4_ * fVar10 + fVar11 * auVar8._4_4_;
  __x = 1.0 - ni_over_nt * ni_over_nt * (1.0 - fVar6 * fVar6);
  if (0.0 < __x) {
    if (__x < 0.0) {
      fVar5 = sqrtf(__x);
    }
    else {
      fVar5 = SQRT(__x);
    }
    fVar2 = normal->e[2];
    *(ulong *)refracted->e =
         CONCAT44(ni_over_nt * (auVar8._4_4_ - fVar11 * fVar6) -
                  fVar5 * (float)((ulong)*(undefined8 *)normal->e >> 0x20),
                  ni_over_nt * (auVar8._0_4_ - fVar10 * fVar6) -
                  fVar5 * (float)*(undefined8 *)normal->e);
    refracted->e[2] = (fVar1 / fVar4 - fVar9 * fVar6) * ni_over_nt - fVar2 * fVar5;
  }
  return 0.0 < __x;
}

Assistant:

bool
refract(const Vec3& vector, const Vec3& normal, float ni_over_nt, Vec3& refracted)
{
    Vec3  _uv           = unit_vector(vector);
    float _dt           = dot(_uv, normal);
    float _discriminant = 1.0f - ni_over_nt*ni_over_nt*(1.0f-_dt*_dt);

    if (_discriminant > 0.0f) {
        refracted = ni_over_nt*(_uv - normal*_dt) - normal*sqrt(_discriminant);
        return true;
    }
    return false;
}